

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O0

void cv_delfini(EditLine *el)

{
  wchar_t wVar1;
  wchar_t local_14;
  wchar_t action;
  wchar_t size;
  EditLine *el_local;
  
  wVar1 = (el->el_chared).c_vcmd.action;
  if ((wVar1 & 2U) != 0) {
    (el->el_map).current = (el->el_map).key;
  }
  if ((el->el_chared).c_vcmd.pos != (wchar_t *)0x0) {
    local_14 = (wchar_t)((long)(el->el_line).cursor - (long)(el->el_chared).c_vcmd.pos >> 2);
    if (local_14 == L'\0') {
      local_14 = L'\x01';
    }
    (el->el_line).cursor = (el->el_chared).c_vcmd.pos;
    if ((wVar1 & 4U) == 0) {
      if (local_14 < L'\x01') {
        c_delbefore(el,-local_14);
        (el->el_line).cursor = (el->el_line).cursor + local_14;
      }
      else {
        c_delafter(el,local_14);
        re_refresh_cursor(el);
      }
    }
    else if (local_14 < L'\x01') {
      cv_yank(el,(el->el_line).cursor + local_14,-local_14);
    }
    else {
      cv_yank(el,(el->el_line).cursor,local_14);
    }
    (el->el_chared).c_vcmd.action = L'\0';
  }
  return;
}

Assistant:

libedit_private void
cv_delfini(EditLine *el)
{
	int size;
	int action = el->el_chared.c_vcmd.action;

	if (action & INSERT)
		el->el_map.current = el->el_map.key;

	if (el->el_chared.c_vcmd.pos == 0)
		/* sanity */
		return;

	size = (int)(el->el_line.cursor - el->el_chared.c_vcmd.pos);
	if (size == 0)
		size = 1;
	el->el_line.cursor = el->el_chared.c_vcmd.pos;
	if (action & YANK) {
		if (size > 0)
			cv_yank(el, el->el_line.cursor, size);
		else
			cv_yank(el, el->el_line.cursor + size, -size);
	} else {
		if (size > 0) {
			c_delafter(el, size);
			re_refresh_cursor(el);
		} else  {
			c_delbefore(el, -size);
			el->el_line.cursor += size;
		}
	}
	el->el_chared.c_vcmd.action = NOP;
}